

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall ValueTest::checkMemberCount(ValueTest *this,Value *value,uint expectedCount)

{
  bool bVar1;
  undefined4 in_EDX;
  ValueIteratorBase *in_RDI;
  PredicateContext _minitest_Context;
  iterator it;
  iterator itEnd;
  uint count;
  char (*in_stack_00000128) [22];
  TestResult *in_stack_00000130;
  SelfType *in_stack_ffffffffffffff78;
  undefined8 uVar2;
  undefined4 in_stack_ffffffffffffff90;
  uint in_stack_ffffffffffffff98;
  uint in_stack_ffffffffffffff9c;
  TestResult *in_stack_ffffffffffffffa0;
  Value *in_stack_ffffffffffffffc8;
  ValueTest *in_stack_ffffffffffffffd0;
  
  uVar2 = *(undefined8 *)&in_RDI->isNull_;
  Json::Value::size((Value *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  JsonTest::checkEqual<unsigned_int,unsigned_int>
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98,
             (char *)CONCAT44(in_EDX,in_stack_ffffffffffffff90),(uint)((ulong)uVar2 >> 0x20),
             (char *)in_RDI);
  Json::Value::end((Value *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  Json::Value::begin((Value *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  while( true ) {
    bVar1 = Json::ValueIteratorBase::operator!=(in_RDI,in_stack_ffffffffffffff78);
    if (!bVar1) break;
    Json::ValueIterator::operator++((ValueIterator *)in_RDI);
  }
  JsonTest::checkEqual<unsigned_int,unsigned_int>
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98,
             (char *)CONCAT44(in_EDX,in_stack_ffffffffffffff90),(uint)((ulong)uVar2 >> 0x20),
             (char *)in_RDI);
  JsonTest::TestResult::operator<<(in_stack_00000130,in_stack_00000128);
  *(undefined1 **)(*(long *)(*(long *)&in_RDI->isNull_ + 8) + 0x20) = &stack0xffffffffffffff98;
  **(int **)&in_RDI->isNull_ = **(int **)&in_RDI->isNull_ + 1;
  *(undefined1 **)(*(long *)&in_RDI->isNull_ + 8) = &stack0xffffffffffffff98;
  checkConstMemberCount(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,0);
  JsonTest::TestResult::popPredicateContext(*(TestResult **)&in_RDI->isNull_);
  return;
}

Assistant:

void ValueTest::checkMemberCount(Json::Value& value,
                                 unsigned int expectedCount) {
  JSONTEST_ASSERT_EQUAL(expectedCount, value.size());

  unsigned int count = 0;
  Json::Value::iterator itEnd = value.end();
  for (Json::Value::iterator it = value.begin(); it != itEnd; ++it) {
    ++count;
  }
  JSONTEST_ASSERT_EQUAL(expectedCount, count) << "Json::Value::iterator";

  JSONTEST_ASSERT_PRED(checkConstMemberCount(value, expectedCount));
}